

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void changeWindowState(_GLFWwindow *window,Atom state,wchar_t action)

{
  undefined4 local_e0 [2];
  XEvent event;
  Atom AStack_18;
  wchar_t action_local;
  Atom state_local;
  _GLFWwindow *window_local;
  
  event.pad[0x17]._4_4_ = action;
  AStack_18 = state;
  state_local = (Atom)window;
  memset(local_e0,0,0xc0);
  local_e0[0] = 0x21;
  event.xany.display = (Display *)*(undefined8 *)(state_local + 0x270);
  event.xfocus.mode = 0x20;
  event.xany.window = _glfw.x11.NET_WM_STATE;
  event.xkey.subwindow = (Window)(int)event.pad[0x17]._4_4_;
  event.xselectionrequest.target = AStack_18;
  event.xselectionrequest.property = 0;
  event.xconfigure.above = 1;
  XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,local_e0);
  return;
}

Assistant:

static void changeWindowState(_GLFWwindow* window, Atom state, int action)
{
    XEvent event;
    memset(&event, 0, sizeof(event));

    event.type = ClientMessage;
    event.xclient.window = window->x11.handle;
    event.xclient.format = 32; // Data is 32-bit longs
    event.xclient.message_type = _glfw.x11.NET_WM_STATE;
    event.xclient.data.l[0] = action;
    event.xclient.data.l[1] = state;
    event.xclient.data.l[2] = 0; // No secondary property
    event.xclient.data.l[3] = 1; // Sender is a normal application

    XSendEvent(_glfw.x11.display,
               _glfw.x11.root,
               False,
               SubstructureNotifyMask | SubstructureRedirectMask,
               &event);
}